

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool __thiscall Path::isHeader(Path *this)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  Type TVar4;
  uint uVar5;
  size_type sVar6;
  char *ext;
  
  TVar4 = type(this);
  if (TVar4 != File) {
    return false;
  }
  sVar6 = (this->super_String).mString._M_string_length;
  if (sVar6 != 0) {
    pcVar2 = (this->super_String).mString._M_dataplus._M_p;
    ext = (pointer)0x0;
    do {
      sVar6 = sVar6 - 1;
      uVar5 = (uint)sVar6;
      if ((int)uVar5 < 0) goto LAB_0014fad8;
      cVar1 = pcVar2[uVar5 & 0x7fffffff];
      if (cVar1 == '/') goto LAB_0014fad8;
    } while (cVar1 != '.');
    ext = pcVar2 + (ulong)(uVar5 & 0x7fffffff) + 1;
LAB_0014fad8:
    if (-1 < (int)uVar5) goto LAB_0014fade;
  }
  ext = (char *)0x0;
LAB_0014fade:
  bVar3 = isHeader(ext);
  return bVar3;
}

Assistant:

bool Path::isHeader() const
{
    return isFile() && isHeader(extension());
}